

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.h
# Opt level: O0

bool match_int_fast_n(int *val,StreamCursor *cursor,size_t size)

{
  char cVar1;
  bool bVar2;
  size_t sVar3;
  int local_44;
  char c;
  size_t sStack_40;
  int integer;
  size_t remaining;
  char *p;
  size_t i;
  size_t size_local;
  StreamCursor *cursor_local;
  int *val_local;
  
  bVar2 = StreamCursor::eof(cursor);
  if (bVar2) {
    val_local._7_1_ = false;
  }
  else {
    p = (char *)0x0;
    remaining = (size_t)StreamCursor::offset(cursor);
    sStack_40 = StreamCursor::remaining(cursor);
    local_44 = 0;
    while( true ) {
      sVar3 = remaining + 1;
      cVar1 = *(char *)remaining;
      if ((cVar1 < '0') || ('9' < cVar1)) break;
      local_44 = cVar1 + -0x30 + local_44 * 10;
      p = p + 1;
      sStack_40 = sStack_40 - 1;
      if ((sStack_40 == 0) || ((remaining = sVar3, size != 0 && (p == (char *)size)))) break;
    }
    if (p == (char *)0x0) {
      val_local._7_1_ = false;
    }
    else {
      *val = local_44;
      StreamCursor::advance(cursor,(size_t)p);
      val_local._7_1_ = true;
    }
  }
  return val_local._7_1_;
}

Assistant:

inline bool match_int_fast_n(int *val, StreamCursor& cursor, size_t size)
{
    if (cursor.eof())
        return false;

    size_t i = 0;
    const char* p = cursor.offset();
    size_t remaining = cursor.remaining();

    int integer = 0;

    for (;;)
    {
        const char c = *p++;
        if (!(c >= '0' && c <= '9'))
            break;

        integer *= 10;
        integer += (c - '0');

        ++i;
        if (--remaining == 0 || (size > 0 && i == size))
            break;
    }

    if (i > 0) {
        *val = integer;
        cursor.advance(i);
        return true;
    }

    return false;

}